

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlUTF8Strsize(xmlChar *utf,int len)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  ulong local_40;
  size_t ret;
  byte *pbStack_28;
  int ch;
  xmlChar *ptr;
  int len_local;
  xmlChar *utf_local;
  
  if (utf == (xmlChar *)0x0) {
    utf_local._4_4_ = 0;
  }
  else {
    pbStack_28 = utf;
    ptr._4_4_ = len;
    if (len < 1) {
      utf_local._4_4_ = 0;
    }
    else {
      while ((iVar2 = ptr._4_4_ + -1, 0 < ptr._4_4_ && (*pbStack_28 != 0))) {
        pbVar3 = pbStack_28 + 1;
        bVar1 = *pbStack_28;
        pbStack_28 = pbVar3;
        ptr._4_4_ = iVar2;
        if ((bVar1 & 0x80) != 0) {
          for (; (bVar1 = bVar1 << 1, (bVar1 & 0x80) != 0 && (*pbStack_28 != 0));
              pbStack_28 = pbStack_28 + 1) {
          }
        }
      }
      local_40 = (long)pbStack_28 - (long)utf;
      if (0x7fffffff < local_40) {
        local_40 = 0;
      }
      utf_local._4_4_ = (int)local_40;
    }
  }
  return utf_local._4_4_;
}

Assistant:

int
xmlUTF8Strsize(const xmlChar *utf, int len) {
    const xmlChar *ptr=utf;
    int ch;
    size_t ret;

    if (utf == NULL)
        return(0);

    if (len <= 0)
        return(0);

    while ( len-- > 0) {
        if ( !*ptr )
            break;
        if ( (ch = *ptr++) & 0x80)
            while ((ch<<=1) & 0x80 ) {
		if (*ptr == 0) break;
                ptr++;
	    }
    }
    ret = ptr - utf;
    return (ret > INT_MAX ? 0 : ret);
}